

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
LargeGapGrayCode::createTransitionSequenceTheorem1
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,LargeGapGrayCode *this,int n,
          int m,vector<char,_std::allocator<char>_> *Z)

{
  char cVar1;
  pointer pcVar2;
  pointer piVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> B;
  vector<int,_std::allocator<int>_> A;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(Z->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(Z->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start,
             (allocator_type *)
             &B.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &B.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (this->m_transitionSequences).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)n + -1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_60,
             (this->m_transitionSequences).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)m + -1);
  pcVar2 = (Z->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar6 = (long)(Z->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
                ._M_finish - (long)pcVar2;
  if (lVar6 != 0) {
    piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    iVar7 = 0;
    iVar8 = 0;
    do {
      cVar1 = pcVar2[lVar9];
      if (cVar1 == 'b') {
        uVar5 = (ulong)iVar7;
        iVar7 = iVar7 + 1;
        iVar4 = *(int *)((long)local_60 +
                        (uVar5 % (ulong)((long)B.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start -
                                         (long)local_60 >> 2)) * 4) + n;
LAB_00104e8b:
        piVar3[lVar9] = iVar4;
      }
      else if (cVar1 == 'a') {
        uVar5 = (ulong)iVar8;
        iVar8 = iVar8 + 1;
        iVar4 = B.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage
                [uVar5 % (ulong)((long)A.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start -
                                 (long)B.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage >> 2)];
        goto LAB_00104e8b;
      }
      lVar9 = lVar9 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar9);
  }
  if (local_60 != (undefined1  [8])0x0) {
    operator_delete((void *)local_60);
  }
  if (B.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(B.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> LargeGapGrayCode::createTransitionSequenceTheorem1(int n, int m, const std::vector<char>& Z)
{
	std::vector<int> tmp(Z.size());

	std::vector<int> A = m_transitionSequences[n-1];
	std::vector<int> B = m_transitionSequences[m-1];
	int idxA = 0;
	int idxB = 0;

	for(int i = 0; i < Z.size(); i++)
    	{
		if(Z[i] == 'a') {
			tmp[i] = A[idxA++ % A.size()];
		}
		else if(Z[i] == 'b') {
			tmp[i] = B[idxB++ % B.size()] + n;
		}
    	}
	return tmp;
}